

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnCallIndirectExpr
          (ExprVisitorDelegate *this,CallIndirectExpr *expr)

{
  WatWriter *this_00;
  bool bVar1;
  char *pcVar2;
  int __c;
  CallIndirectExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  this_00 = this->writer_;
  pcVar2 = Opcode::GetName((Opcode *)&Opcode::CallIndirect_Opcode);
  WritePutsSpace(this_00,pcVar2);
  bVar1 = Var::is_index(&expr->table);
  if ((!bVar1) || (pcVar2 = Var::index(&expr->table,pcVar2,__c), (int)pcVar2 != 0)) {
    WriteVar(this->writer_,&expr->table,Space);
  }
  WriteOpenSpace(this->writer_,"type");
  WriteVar(this->writer_,&(expr->decl).type_var,Newline);
  WriteCloseNewline(this->writer_);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnCallIndirectExpr(
    CallIndirectExpr* expr) {
  writer_->WritePutsSpace(Opcode::CallIndirect_Opcode.GetName());
  if (!expr->table.is_index() || expr->table.index() != 0) {
    writer_->WriteVar(expr->table, NextChar::Space);
  }
  writer_->WriteOpenSpace("type");
  writer_->WriteVar(expr->decl.type_var, NextChar::Newline);
  writer_->WriteCloseNewline();
  return Result::Ok;
}